

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_pointer.cc
# Opt level: O1

void simple_map(void)

{
  char *pcVar1;
  ulong uVar2;
  slot_type *psVar3;
  uint uVar4;
  ushort uVar5;
  byte bVar6;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
  *this;
  size_t i;
  MappedReference<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>_> pLVar7;
  ostream *this_00;
  long *plVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong hashval;
  bool bVar17;
  __m128i match;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  managed_mapped_file mmap_file;
  segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  *local_88;
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  local_80;
  in_place_interface local_58;
  undefined1 *local_38;
  char cVar20;
  char cVar22;
  char cVar23;
  char cVar24;
  
  local_58._vptr_in_place_interface =
       (_func_int **)CONCAT44(local_58._vptr_in_place_interface._4_4_,0x1a4);
  boost::interprocess::
  basic_managed_mapped_file<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
  ::basic_managed_mapped_file(&local_80,"map_iv.dat",1000000,0,&local_58);
  local_88 = local_80.
             super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
             .mp_header;
  local_58.alignment = 8;
  local_58.size = 0x38;
  local_58.type_name =
       "N5phmap13flat_hash_mapIKmZ10simple_mapvE7LatpLonSt4hashImESt8equal_toImEN5boost12interprocess9allocatorISt4pairIS1_S2_ENS8_15segment_managerIcNS8_15rbtree_best_fitINS8_12mutex_familyENS8_10offset_ptrIvlmLm0EEELm0EEENS8_10iset_indexEEEEEEE"
  ;
  local_58._vptr_in_place_interface = (_func_int **)&PTR_construct_n_0011cc38;
  local_38 = (undefined1 *)&local_88;
  this = (raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          *)boost::interprocess::
            segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
            ::priv_generic_construct
                      (local_80.
                       super_basic_managed_memory_impl<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index,_16UL>
                       .mp_header,"node_store",1,true,true,&local_58);
  uVar16 = 0;
  do {
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar16;
    hashval = SUB168(auVar18 * ZEXT816(0xde5fb9d2630458e9),8) +
              SUB168(auVar18 * ZEXT816(0xde5fb9d2630458e9),0);
    bVar6 = (byte)hashval;
    if (this->ctrl_ == (ctrl_t *)0x0) {
LAB_001026dc:
      i = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
          ::prepare_insert(this,hashval);
      psVar3 = this->slots_;
      psVar3[i].value.first = uVar16;
      *(undefined8 *)((long)psVar3 + i * 0x10 + 8) = 0xa0000000a;
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<const_unsigned_long,_LatpLon>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_boost::interprocess::allocator<std::pair<const_unsigned_long,_LatpLon>,_boost::interprocess::segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>_>_>
      ::set_ctrl(this,i,bVar6 & 0x7f);
    }
    else {
      uVar2 = this->capacity_;
      if ((uVar2 + 1 & uVar2) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
      }
      uVar9 = hashval >> 7 & uVar2;
      auVar18 = ZEXT216(CONCAT11(bVar6,bVar6) & 0x7f7f);
      auVar18 = pshuflw(auVar18,auVar18,0);
      lVar12 = 0;
      uVar11 = (ulong)(bVar6 & 0x7f);
      do {
        pcVar1 = this->ctrl_ + uVar9;
        cVar20 = auVar18[0];
        auVar21[0] = -(cVar20 == *pcVar1);
        cVar22 = auVar18[1];
        auVar21[1] = -(cVar22 == pcVar1[1]);
        cVar23 = auVar18[2];
        auVar21[2] = -(cVar23 == pcVar1[2]);
        cVar24 = auVar18[3];
        auVar21[3] = -(cVar24 == pcVar1[3]);
        auVar21[4] = -(cVar20 == pcVar1[4]);
        auVar21[5] = -(cVar22 == pcVar1[5]);
        auVar21[6] = -(cVar23 == pcVar1[6]);
        auVar21[7] = -(cVar24 == pcVar1[7]);
        auVar21[8] = -(cVar20 == pcVar1[8]);
        auVar21[9] = -(cVar22 == pcVar1[9]);
        auVar21[10] = -(cVar23 == pcVar1[10]);
        auVar21[0xb] = -(cVar24 == pcVar1[0xb]);
        auVar21[0xc] = -(cVar20 == pcVar1[0xc]);
        auVar21[0xd] = -(cVar22 == pcVar1[0xd]);
        auVar21[0xe] = -(cVar23 == pcVar1[0xe]);
        auVar21[0xf] = -(cVar24 == pcVar1[0xf]);
        uVar5 = (ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe | (ushort)(auVar21[0xf] >> 7) << 0xf;
        bVar17 = uVar5 == 0;
        if (bVar17) {
LAB_0010268a:
          iVar13 = 4;
          uVar15 = uVar11;
        }
        else {
          uVar14 = (uint)uVar5;
          uVar4 = 0;
          if (uVar5 != 0) {
            for (; (uVar5 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          iVar13 = 1;
          while (uVar15 = uVar4 + uVar9 & uVar2, this->slots_[uVar15].value.first != uVar16) {
            uVar14 = uVar14 - 1 & uVar14;
            bVar17 = uVar14 == 0;
            if (bVar17) goto LAB_0010268a;
            uVar4 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
              }
            }
          }
          bVar17 = false;
        }
        if (bVar17) {
          auVar19[0] = -(*pcVar1 == -0x80);
          auVar19[1] = -(pcVar1[1] == -0x80);
          auVar19[2] = -(pcVar1[2] == -0x80);
          auVar19[3] = -(pcVar1[3] == -0x80);
          auVar19[4] = -(pcVar1[4] == -0x80);
          auVar19[5] = -(pcVar1[5] == -0x80);
          auVar19[6] = -(pcVar1[6] == -0x80);
          auVar19[7] = -(pcVar1[7] == -0x80);
          auVar19[8] = -(pcVar1[8] == -0x80);
          auVar19[9] = -(pcVar1[9] == -0x80);
          auVar19[10] = -(pcVar1[10] == -0x80);
          auVar19[0xb] = -(pcVar1[0xb] == -0x80);
          auVar19[0xc] = -(pcVar1[0xc] == -0x80);
          auVar19[0xd] = -(pcVar1[0xd] == -0x80);
          auVar19[0xe] = -(pcVar1[0xe] == -0x80);
          auVar19[0xf] = -(pcVar1[0xf] == -0x80);
          iVar13 = 3;
          if ((((((((((((((((auVar19 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar19 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar19 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar19 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar19 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar19 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar19 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar19 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar19 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar19 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar19 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar19 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar19 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar19 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar19 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar19[0xf]) {
            lVar10 = uVar9 + lVar12;
            lVar12 = lVar12 + 0x10;
            uVar9 = lVar10 + 0x10U & uVar2;
            iVar13 = 0;
          }
        }
        uVar11 = uVar15;
      } while (iVar13 == 0);
      if ((iVar13 == 3) || (uVar15 == 0xffffffffffffffff)) goto LAB_001026dc;
    }
    uVar16 = uVar16 + 1;
    if (uVar16 == 1000) {
      local_58._vptr_in_place_interface = (_func_int **)0xa;
      pLVar7 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)&local_58);
      this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pLVar7->latp);
      std::__ostream_insert<char,std::char_traits<char>>(this_00," ",1);
      local_88 = (segment_manager<char,_boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,_boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>,_0UL>,_boost::interprocess::iset_index>
                  *)0xa;
      pLVar7 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
               ::
               at<unsigned_long_const,phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>>
                         ((raw_hash_map<phmap::priv::FlatHashMapPolicy<unsigned_long_const,simple_map()::LatpLon>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,boost::interprocess::allocator<std::pair<unsigned_long_const,simple_map()::LatpLon>,boost::interprocess::segment_manager<char,boost::interprocess::rbtree_best_fit<boost::interprocess::mutex_family,boost::interprocess::offset_ptr<void,long,unsigned_long,0ul>,0ul>,boost::interprocess::iset_index>>>
                           *)this,(key_arg<const_unsigned_long> *)&local_88);
      plVar8 = (long *)std::ostream::operator<<(this_00,pLVar7->lon);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      boost::interprocess::ipcdetail::
      managed_open_or_create_impl<boost::interprocess::ipcdetail::file_wrapper,_16UL,_true,_false>::
      ~managed_open_or_create_impl(&local_80.m_mfile);
      return;
    }
  } while( true );
}

Assistant:

void simple_map() {
   struct LatpLon {
      int32_t latp;
      int32_t lon;
   };

   using nodestore_pair_t = std::pair<const uint64_t, LatpLon>;
   using map_t            = phmap::flat_hash_map<const uint64_t, LatpLon, std::hash<uint64_t>, std::equal_to<uint64_t>,
                                                 bi_alloc_t<nodestore_pair_t>>;

   auto mmap_file =
      boost::interprocess::managed_mapped_file(boost::interprocess::open_or_create, "map_iv.dat", 1000000);
   map_t* map = mmap_file.find_or_construct<map_t>("node_store")(mmap_file.get_segment_manager());

   for (unsigned int i = 0; i < 1000; ++i) {
      LatpLon p = {10, 10};
      map->emplace(i, p);
   }

   std::cout << map->at(10).latp << " " << map->at(10).lon << std::endl;
}